

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  long lVar2;
  long lVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  VecAccess<float,_4,_3> *this;
  Matrix<float,_4,_4> retVal;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  MatrixCaseUtils local_b4 [12];
  VecAccess<float,_4,_3> local_a8 [2];
  Matrix<float,_4,_4> local_68;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_c8.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_c8.m_data._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    tcu::Vector<float,_4>::Vector
              (&local_c8,(Vector<float,_4> *)sr::(anonymous_namespace)::s_constInVec4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_d8.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    local_d8.m_data._8_8_ = *(undefined8 *)((evalCtx->coords).m_data + 2);
  }
  else {
    tcu::Vector<float,_4>::Vector
              (&local_d8,(Vector<float,_4> *)(sr::(anonymous_namespace)::s_constInVec4 + 0x10));
  }
  this = local_a8;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)this);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar1 = local_d8.m_data[lVar2];
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      this->m_index[lVar3 + -2] = (int)(*(float *)((long)local_c8.m_data + lVar3) * fVar1);
    }
    this = (VecAccess<float,_4,_3> *)
           (((Vector<tcu::Vector<float,_4>,_4> *)&this->m_vector)->m_data[0].m_data + 1);
  }
  tcu::transpose<float,4,4>
            (&local_68,(tcu *)local_a8,(Matrix<float,_4,_4> *)CONCAT44(extraout_var,extraout_EDX));
  reduceToVec3(local_b4,&local_68);
  local_a8[0].m_vector = &evalCtx->color;
  local_a8[0].m_index[0] = 0;
  local_a8[0].m_index[1] = 1;
  local_a8[0].m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(local_a8,(Vector<float,_3> *)local_b4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}